

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

bool __thiscall
QListModeViewBase::dropOn
          (QListModeViewBase *this,QDropEvent *event,int *dropRow,int *dropCol,
          QModelIndex *dropIndex)

{
  QWidgetData *pQVar1;
  QListViewPrivate *this_00;
  QListView *pQVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  QRect QVar5;
  QRect QVar6;
  QRect QVar7;
  QRect QVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  char cVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  LayoutDirection LVar16;
  DropIndicatorPosition DVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  QCommonListViewBase *pQVar21;
  long in_FS_OFFSET;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 local_98 [16];
  QPoint local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [8];
  QPoint QStack_60;
  QPoint QStack_58;
  undefined1 local_48 [8];
  QPoint QStack_40;
  long local_38;
  
  QVar8._8_8_ = QStack_60;
  QVar8._0_8_ = local_68;
  QVar6._8_8_ = local_98._8_8_;
  QVar6._0_8_ = local_98._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (event[0xc] == (QDropEvent)0x0) {
    local_68._0_4_ = -1;
    local_68._4_4_ = -1;
    QStack_60.xp.m_i = 0;
    QStack_60.yp.m_i = 0;
    QStack_58.xp.m_i = 0;
    QStack_58.yp.m_i = 0;
    pQVar1 = ((((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
              super_QAbstractScrollAreaPrivate.viewport)->data;
    local_98._8_8_ =
         CONCAT44((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i,
                  (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i);
    local_98._0_4_ = 0;
    local_98._4_4_ = 0;
    dVar25 = (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(event + 0x10);
    bVar12 = 2147483647.0 < dVar25;
    if (dVar25 <= -2147483648.0) {
      dVar25 = -2147483648.0;
    }
    local_48._0_4_ =
         (undefined4)(double)(-(ulong)bVar12 & 0x41dfffffffc00000 | ~-(ulong)bVar12 & (ulong)dVar25)
    ;
    dVar25 = (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(event + 0x18);
    bVar12 = 2147483647.0 < dVar25;
    if (dVar25 <= -2147483648.0) {
      dVar25 = -2147483648.0;
    }
    local_48._4_4_ =
         (int)(double)(-(ulong)bVar12 & 0x41dfffffffc00000 | ~-(ulong)bVar12 & (ulong)dVar25);
    cVar11 = QRect::contains((QPoint *)local_98,SUB81(local_48,0));
    if (cVar11 != '\0') {
      auVar22._0_8_ =
           (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(event + 0x10);
      auVar22._8_8_ =
           (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(event + 0x18);
      auVar23 = maxpd(auVar22,_DAT_006605e0);
      iVar14 = (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[0xd])(this);
      iVar15 = (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[0xe])(this);
      iVar14 = iVar14 + (int)(double)(~-(ulong)(2147483647.0 < auVar22._0_8_) & auVar23._0_8_ |
                                     -(ulong)(2147483647.0 < auVar22._0_8_) & 0x41dfffffffc00000);
      iVar15 = iVar15 + (int)(double)(~-(ulong)(2147483647.0 < auVar22._8_8_) & auVar23._8_8_ |
                                     -(ulong)(2147483647.0 < auVar22._8_8_) & 0x41dfffffffc00000);
      auVar3._4_8_ = SUB168(ZEXT1216((undefined1  [12])0x0),4);
      auVar3._0_4_ = iVar15;
      auVar23._0_8_ = auVar3._0_8_ << 0x20;
      auVar23._8_4_ = iVar14;
      auVar23._12_4_ = iVar15;
      this_00 = (this->super_QCommonListViewBase).dd;
      iVar20 = this_00->space;
      local_78 = CONCAT44(iVar15 - iVar20,iVar14 - iVar20);
      auVar4._4_8_ = auVar23._8_8_;
      auVar4._0_4_ = iVar15 + iVar20;
      auVar24._0_8_ = auVar4._0_8_ << 0x20;
      auVar24._8_4_ = iVar14 + iVar20;
      auVar24._12_4_ = iVar15 + iVar20;
      uStack_70 = auVar24._8_8_;
      local_88 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
         ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
        QAbstractItemViewPrivate::interruptDelayedItemsLayout
                  (&this_00->super_QAbstractItemViewPrivate);
        (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      LVar16 = QWidget::layoutDirection
                         (*(QWidget **)
                           &(this_00->super_QAbstractItemViewPrivate).
                            super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                            super_QWidgetPrivate.field_0x8);
      _local_48 = QRect::normalized();
      uVar18 = local_48;
      if (LVar16 == RightToLeft) {
        pQVar1 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 viewport)->data;
        iVar14 = ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1;
        pQVar21 = this_00->commonListView;
        iVar20 = (pQVar21->contentsSize).wd.m_i;
        if (iVar14 <= iVar20) {
          iVar14 = iVar20;
        }
        uVar19 = ~local_48._8_4_ + iVar14;
        QStack_40 = (QPoint)((ulong)((local_48._8_4_ - local_48._0_4_) + uVar19) |
                            local_48._8_8_ & 0xffffffff00000000);
        local_48 = (undefined1  [8])((ulong)uVar19 | uVar18 & 0xffffffff00000000);
      }
      else {
        pQVar21 = this_00->commonListView;
      }
      (*pQVar21->_vptr_QCommonListViewBase[7])(local_98,pQVar21,local_48);
      if (local_88 == (QPoint)0x0) {
        local_48._0_4_ = 0;
        local_48._4_4_ = 0;
        QStack_40.xp.m_i = 0;
        QStack_40.yp.m_i = 0;
        local_68._0_4_ = -1;
        local_68._4_4_ = -1;
      }
      else {
        local_68._0_4_ = *(int *)(local_98._8_8_ + (long)local_88 * 0x18 + -0x18);
        local_68._4_4_ = *(int *)(local_98._8_8_ + (long)local_88 * 0x18 + -0x14);
        local_48 = *(undefined1 (*) [8])(local_98._8_8_ + (long)local_88 * 0x18 + -0x10);
        QStack_40 = ((QPoint *)(local_98._8_8_ + (long)local_88 * 0x18 + -0x10))[1];
      }
      QStack_60.xp.m_i = local_48._0_4_;
      QStack_60.yp.m_i = local_48._4_4_;
      QStack_58 = QStack_40;
      if ((((int)local_68._0_4_ < 0) || ((int)local_68._4_4_ < 0)) || (QStack_40 == (QPoint)0x0)) {
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QModelIndex *)local_68,
                   &(((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).root);
      }
      if ((QPoint)local_98._0_8_ != (QPoint)0x0) {
        LOCK();
        *(int *)local_98._0_8_ = *(int *)local_98._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_98._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_98._0_8_,0x18,0x10);
        }
      }
    }
    uVar19 = (**(code **)(*(long *)(((this->super_QCommonListViewBase).dd)->
                                   super_QAbstractItemViewPrivate).model + 0xe8))();
    QVar8.x2.m_i = QStack_60.xp.m_i;
    QVar8.y2.m_i = QStack_60.yp.m_i;
    QVar8.x1.m_i = local_68._0_4_;
    QVar8.y1.m_i = local_68._4_4_;
    QVar6.x2.m_i = local_98._8_4_;
    QVar6.y2.m_i = local_98._12_4_;
    QVar6.x1.m_i = local_98._0_4_;
    QVar6.y1.m_i = local_98._4_4_;
    if ((*(uint *)(event + 0x2c) & uVar19) != 0) {
      cVar11 = comparesEqual(&(((this->super_QCommonListViewBase).dd)->
                              super_QAbstractItemViewPrivate).root,(QModelIndex *)local_68);
      QVar7.x2.m_i = QStack_60.xp.m_i;
      QVar7.y2.m_i = QStack_60.yp.m_i;
      QVar7.x1.m_i = local_68._0_4_;
      QVar7.y1.m_i = local_68._4_4_;
      QVar5.x2.m_i = local_98._8_4_;
      QVar5.y2.m_i = local_98._12_4_;
      QVar5.x1.m_i = local_98._0_4_;
      QVar5.y1.m_i = local_98._4_4_;
      if (cVar11 == '\0') {
        dVar25 = (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000
                         ) + *(double *)(event + 0x10);
        bVar12 = 2147483647.0 < dVar25;
        if (dVar25 <= -2147483648.0) {
          dVar25 = -2147483648.0;
        }
        local_48._0_4_ =
             (undefined4)
             (double)(-(ulong)bVar12 & 0x41dfffffffc00000 | ~-(ulong)bVar12 & (ulong)dVar25);
        dVar25 = (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000
                         ) + *(double *)(event + 0x18);
        bVar12 = 2147483647.0 < dVar25;
        if (dVar25 <= -2147483648.0) {
          dVar25 = -2147483648.0;
        }
        local_48._4_4_ =
             (int)(double)(-(ulong)bVar12 & 0x41dfffffffc00000 | ~-(ulong)bVar12 & (ulong)dVar25);
        pQVar2 = (this->super_QCommonListViewBase).qq;
        local_98 = (**(code **)(*(long *)&(pQVar2->super_QAbstractItemView).
                                          super_QAbstractScrollArea.super_QFrame.super_QWidget +
                               0x1e0))(pQVar2,(QModelIndex *)local_68);
        DVar17 = position(this,(QPoint *)local_48,(QRect *)local_98,(QModelIndex *)local_68);
        QVar7.x2.m_i = QStack_60.xp.m_i;
        QVar7.y2.m_i = QStack_60.yp.m_i;
        QVar7.x1.m_i = local_68._0_4_;
        QVar7.y1.m_i = local_68._4_4_;
        (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
        dropIndicatorPosition = DVar17;
        uVar9 = local_68._0_4_;
        uVar10 = local_68._4_4_;
        if (DVar17 == BelowItem) {
          if (QStack_58 == (QPoint)0x0) {
            local_98 = ZEXT816(0xffffffffffffffff);
            local_88.xp.m_i = 0;
            local_88.yp.m_i = 0;
          }
          else {
            (**(code **)(*(long *)QStack_58 + 0x68))(local_98,QStack_58,local_68);
          }
          iVar20 = uVar9 + 1;
          QStack_58 = local_88;
          iVar14 = uVar10;
          QVar7 = (QRect)local_98;
        }
        else {
          iVar20 = -1;
          iVar14 = -1;
          if (DVar17 == AboveItem) {
            if (QStack_58 == (QPoint)0x0) {
              local_98 = ZEXT816(0xffffffffffffffff);
              local_88.xp.m_i = 0;
              local_88.yp.m_i = 0;
            }
            else {
              (**(code **)(*(long *)QStack_58 + 0x68))(local_98,QStack_58,local_68);
            }
            QStack_58 = local_88;
            iVar20 = uVar9;
            iVar14 = uVar10;
            QVar7 = (QRect)local_98;
          }
        }
      }
      else {
        (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
        dropIndicatorPosition = OnViewport;
        iVar20 = -1;
        iVar14 = -1;
        local_98 = (undefined1  [16])QVar5;
      }
      (dropIndex->m).ptr = (QAbstractItemModel *)QStack_58;
      *(QRect *)dropIndex = QVar7;
      *dropRow = iVar20;
      *dropCol = iVar14;
      _local_68 = QVar7;
      bVar12 = QAbstractItemViewPrivate::droppingOnItself
                         (&((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate,
                          event,(QModelIndex *)local_68);
      bVar13 = true;
      QVar6 = (QRect)local_98;
      QVar8 = _local_68;
      if (!bVar12) goto LAB_0056fa74;
    }
  }
  bVar13 = false;
LAB_0056fa74:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    local_98 = (undefined1  [16])QVar6;
    _local_68 = QVar8;
    __stack_chk_fail();
  }
  return bVar13;
}

Assistant:

bool QListModeViewBase::dropOn(QDropEvent *event, int *dropRow, int *dropCol, QModelIndex *dropIndex)
{
    if (event->isAccepted())
        return false;

    QModelIndex index;
    if (dd->viewport->rect().contains(event->position().toPoint())) {
        // can't use indexAt, doesn't account for spacing.
        QPoint p = event->position().toPoint();
        QRect rect(p.x() + horizontalOffset(), p.y() + verticalOffset(), 1, 1);
        rect.adjust(-dd->spacing(), -dd->spacing(), dd->spacing(), dd->spacing());
        const QList<QModelIndex> intersectVector = dd->intersectingSet(rect);
        index = intersectVector.size() > 0
            ? intersectVector.last() : QModelIndex();
        if (!index.isValid())
            index = dd->root;
    }

    // If we are allowed to do the drop
    if (dd->model->supportedDropActions() & event->dropAction()) {
        int row = -1;
        int col = -1;
        if (index != dd->root) {
            dd->dropIndicatorPosition = position(event->position().toPoint(), qq->visualRect(index), index);
            switch (dd->dropIndicatorPosition) {
            case QAbstractItemView::AboveItem:
                row = index.row();
                col = index.column();
                index = index.parent();
                break;
            case QAbstractItemView::BelowItem:
                row = index.row() + 1;
                col = index.column();
                index = index.parent();
                break;
            case QAbstractItemView::OnItem:
            case QAbstractItemView::OnViewport:
                break;
            }
        } else {
            dd->dropIndicatorPosition = QAbstractItemView::OnViewport;
        }
        *dropIndex = index;
        *dropRow = row;
        *dropCol = col;
        if (!dd->droppingOnItself(event, index))
            return true;
    }
    return false;
}